

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwitchAI.cpp
# Opt level: O2

void __thiscall
tiger::trains::ai::SwitchAI::SwitchAI
          (SwitchAI *this,World *world,
          vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
          *trainAIList)

{
  pointer ppTVar1;
  GoodType GVar2;
  pointer ppTVar3;
  TrainAI *bot;
  TrainAI *local_40;
  World *local_38;
  
  (this->super_ISubBot)._vptr_ISubBot = (_func_int **)&PTR__SwitchAI_0019af90;
  (this->armorBots).
  super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->armorBots).
  super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->armorBots).
  super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->productBots).
  super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->productBots).
  super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->productBots).
  super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppTVar1 = (trainAIList->
            super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  local_38 = world;
  for (ppTVar3 = (trainAIList->
                 super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
                 )._M_impl.super__Vector_impl_data._M_start; ppTVar3 != ppTVar1;
      ppTVar3 = ppTVar3 + 1) {
    local_40 = *ppTVar3;
    GVar2 = TrainAI::getType(local_40);
    if (GVar2 == ARMOR) {
      std::vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>::
      push_back(&this->armorBots,&local_40);
    }
    GVar2 = TrainAI::getType(local_40);
    if (GVar2 == PRODUCT) {
      std::vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>::
      push_back(&this->productBots,&local_40);
    }
  }
  this->world = local_38;
  return;
}

Assistant:

SwitchAI::SwitchAI(const world::World *world, const std::vector<TrainAI *> &trainAIList)
{
    for (TrainAI *bot : trainAIList)
    {
        if (bot->getType() == models::GoodType::ARMOR)
            armorBots.push_back(bot);

        if (bot->getType() == models::GoodType::PRODUCT)
            productBots.push_back(bot);
    }

    this->world = world;
}